

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall llbuild::buildsystem::BuildSystem::build(BuildSystem *this,StringRef name)

{
  BuildSystemImpl *this_00;
  BuildDescription *pBVar1;
  const_iterator cVar2;
  char *pcVar3;
  size_type sVar4;
  BuildKey *this_01;
  StringRef name_00;
  StringRef Key;
  StringRef filename;
  StringRef local_f0;
  BuildKey local_e0;
  Twine local_c0;
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> local_a8;
  pointer pcVar5;
  
  pcVar3 = (char *)name.Length;
  this_01 = (BuildKey *)name.Data;
  this_00 = (BuildSystemImpl *)this->impl;
  local_f0.Data = (char *)this_01;
  local_f0.Length = (size_t)pcVar3;
  if ((this_00->buildDescription)._M_t.
      super___uniq_ptr_impl<llbuild::buildsystem::BuildDescription,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::BuildDescription_*,_std::default_delete<llbuild::buildsystem::BuildDescription>_>
      .super__Head_base<0UL,_llbuild::buildsystem::BuildDescription_*,_false>._M_head_impl ==
      (BuildDescription *)0x0) {
    pcVar5 = (this_00->mainFilename)._M_dataplus._M_p;
    sVar4 = (this_00->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_a8,"no build description loaded");
  }
  else {
    if (pcVar3 == (char *)0x0) {
      pBVar1 = anon_unknown.dwarf_1352d2::BuildSystemImpl::getBuildDescription(this_00);
      this_01 = (BuildKey *)(pBVar1->defaultTarget)._M_dataplus._M_p;
      pcVar3 = (char *)(pBVar1->defaultTarget)._M_string_length;
    }
    local_f0.Data = (char *)this_01;
    local_f0.Length = (size_t)pcVar3;
    pBVar1 = anon_unknown.dwarf_1352d2::BuildSystemImpl::getBuildDescription(this_00);
    Key.Length = (size_t)pcVar3;
    Key.Data = (char *)this_01;
    cVar2 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
            ::find(&pBVar1->targets,Key);
    name_00.Length =
         (pBVar1->targets).super_StringMapImpl.TheTable +
         (pBVar1->targets).super_StringMapImpl.NumBuckets;
    if (cVar2.
        super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
        .Ptr != (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
                 )name_00.Length) {
      name_00.Data = pcVar3;
      BuildKey::makeTarget(&local_e0,this_01,name_00);
      anon_unknown.dwarf_1352d2::BuildSystemImpl::build
                ((Optional<llbuild::buildsystem::BuildValue> *)&local_a8,this_00,&local_e0);
      llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
                (&local_a8);
      std::__cxx11::string::_M_dispose();
      return local_a8.hasVal;
    }
    pcVar5 = (this_00->mainFilename)._M_dataplus._M_p;
    sVar4 = (this_00->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)&local_e0,"No target named \'",&local_f0);
    llvm::Twine::Twine(&local_c0,"\' in build description");
    llvm::Twine::concat((Twine *)&local_a8,(Twine *)&local_e0,&local_c0);
  }
  filename.Length = sVar4;
  filename.Data = pcVar5;
  anon_unknown.dwarf_1352d2::BuildSystemImpl::error(this_00,filename,(Twine *)&local_a8);
  return false;
}

Assistant:

bool BuildSystem::build(StringRef name) {
  return static_cast<BuildSystemImpl*>(impl)->build(name);
}